

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall
Gluco::Solver::minimisationWithBinaryResolution(Solver *this,vec<Gluco::Lit> *out_learnt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Lit *pLVar4;
  uint *puVar5;
  vec<Gluco::Solver::Watcher> *this_00;
  Watcher *pWVar6;
  Lit *pLVar7;
  bool local_85;
  Lit p_1;
  int local_5c;
  int i_1;
  int l;
  int local_50;
  lbool local_49;
  int local_48;
  Lit local_44;
  int local_40;
  Lit imp;
  int k;
  int nb;
  vec<Gluco::Solver::Watcher> *wbin;
  int local_28;
  int i;
  uint local_1c;
  Lit p;
  uint lbd;
  vec<Gluco::Lit> *out_learnt_local;
  Solver *this_local;
  
  _p = out_learnt;
  local_1c = computeLBD(this,out_learnt,-1);
  pLVar4 = vec<Gluco::Lit>::operator[](_p,0);
  i = (int)operator~((Lit)pLVar4->x);
  if (local_1c <= this->lbLBDMinimizingClause) {
    this->MYFLAG = this->MYFLAG + 1;
    for (local_28 = 1; iVar2 = vec<Gluco::Lit>::size(_p), local_28 < iVar2; local_28 = local_28 + 1)
    {
      uVar1 = this->MYFLAG;
      pLVar4 = vec<Gluco::Lit>::operator[](_p,local_28);
      iVar2 = Gluco::var((Lit)pLVar4->x);
      puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar2);
      *puVar5 = uVar1;
    }
    this_00 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
              ::operator[](&this->watchesBin,(Lit *)&i);
    imp.x = 0;
    for (local_40 = 0; iVar2 = local_40, iVar3 = vec<Gluco::Solver::Watcher>::size(this_00),
        iVar2 < iVar3; local_40 = local_40 + 1) {
      pWVar6 = vec<Gluco::Solver::Watcher>::operator[](this_00,local_40);
      local_48 = (pWVar6->blocker).x;
      local_44.x = local_48;
      iVar2 = Gluco::var((Lit)local_48);
      puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar2);
      local_85 = false;
      if (*puVar5 == this->MYFLAG) {
        local_50 = local_44.x;
        local_49 = value(this,local_44);
        lbool::lbool((lbool *)((long)&l + 3),'\0');
        local_85 = lbool::operator==(&local_49,l._3_1_);
      }
      if (local_85 != false) {
        imp.x = imp.x + 1;
        uVar1 = this->MYFLAG;
        iVar2 = Gluco::var(local_44);
        puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar2);
        *puVar5 = uVar1 - 1;
      }
    }
    local_5c = vec<Gluco::Lit>::size(_p);
    local_5c = local_5c + -1;
    if (0 < imp.x) {
      this->nbReducedClauses = this->nbReducedClauses + 1;
      for (p_1.x = 1; iVar2 = vec<Gluco::Lit>::size(_p), p_1.x < iVar2 - imp.x; p_1.x = p_1.x + 1) {
        pLVar4 = vec<Gluco::Lit>::operator[](_p,p_1.x);
        iVar2 = Gluco::var((Lit)pLVar4->x);
        puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar2);
        if (*puVar5 != this->MYFLAG) {
          pLVar4 = vec<Gluco::Lit>::operator[](_p,local_5c);
          iVar2 = pLVar4->x;
          pLVar4 = vec<Gluco::Lit>::operator[](_p,p_1.x);
          pLVar7 = vec<Gluco::Lit>::operator[](_p,local_5c);
          pLVar7->x = pLVar4->x;
          pLVar4 = vec<Gluco::Lit>::operator[](_p,p_1.x);
          pLVar4->x = iVar2;
          local_5c = local_5c + -1;
          p_1.x = p_1.x + -1;
        }
      }
      vec<Gluco::Lit>::shrink(_p,imp.x);
    }
  }
  return;
}

Assistant:

void Solver::minimisationWithBinaryResolution(vec<Lit> &out_learnt) {
  
  // Find the LBD measure                                                                                                         
  unsigned int lbd = computeLBD(out_learnt);
  Lit p = ~out_learnt[0];
  
  if(lbd<=lbLBDMinimizingClause){
    MYFLAG++;
    
    for(int i = 1;i<out_learnt.size();i++) {
      permDiff[var(out_learnt[i])] = MYFLAG;
    }

    vec<Watcher>&  wbin  = watchesBin[p];
    int nb = 0;
    for(int k = 0;k<wbin.size();k++) {
      Lit imp = wbin[k].blocker;
      if(permDiff[var(imp)]==MYFLAG && value(imp)==l_True) {
        nb++;
        permDiff[var(imp)]= MYFLAG-1;
      }
      }
    int l = out_learnt.size()-1;
    if(nb>0) {
      nbReducedClauses++;
      for(int i = 1;i<out_learnt.size()-nb;i++) {
        if(permDiff[var(out_learnt[i])]!=MYFLAG) {
          Lit p = out_learnt[l];
          out_learnt[l] = out_learnt[i];
          out_learnt[i] = p;
          l--;i--;
        }
      }
      
      out_learnt.shrink(nb);
      
    }
  }
}